

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpack-validate.cpp
# Opt level: O3

void usage(char **argv)

{
  char *__s;
  size_t sVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Usage: ",7);
  __s = *argv;
  if (__s == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x11a0f8);
  }
  else {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," [OPTIONS] INFILE",0x11)
  ;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"This program reads the VPack INFILE into a string and ",0x36);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"validates it. Will work only for input files up to 2 GB size.",
             0x3d);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Available options are:",0x16);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             " --hex                     try to turn hex-encoded input into binary vpack",0x4a);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  return;
}

Assistant:

static void usage(char* argv[]) {
  std::cout << "Usage: " << argv[0] << " [OPTIONS] INFILE" << std::endl;
  std::cout << "This program reads the VPack INFILE into a string and "
            << std::endl;
  std::cout << "validates it. Will work only for input files up to 2 GB size."
            << std::endl;
  std::cout << "Available options are:" << std::endl;
  std::cout << " --hex                     try to turn hex-encoded input into "
               "binary vpack"
            << std::endl;
}